

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cp_writer.c
# Opt level: O2

void SendCloseMsgs(SstStream Stream)

{
  undefined8 local_20;
  ssize_t local_18;
  
  local_20 = 0;
  local_18 = Stream->LastProvidedTimestep;
  CP_verbose(Stream,PerStepVerbose,
             "SstWriterClose, Sending Close at Timestep %ld, one to each reader\n");
  sendOneToEachReaderRank
            (Stream,Stream->CPInfo->SharedCM->WriterCloseFormat,&local_20,(void **)&local_20);
  Stream->CloseMessagesSent = 1;
  return;
}

Assistant:

static void SendCloseMsgs(SstStream Stream)
{
    struct _WriterCloseMsg Msg;
    STREAM_ASSERT_LOCKED(Stream);
    memset(&Msg, 0, sizeof(Msg));
    Msg.FinalTimestep = Stream->LastProvidedTimestep;
    CP_verbose(Stream, PerStepVerbose,
               "SstWriterClose, Sending Close at Timestep %ld, one to each reader\n",
               Msg.FinalTimestep);

    sendOneToEachReaderRank(Stream, Stream->CPInfo->SharedCM->WriterCloseFormat, &Msg,
                            &Msg.RS_Stream);
    Stream->CloseMessagesSent = 1;
}